

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

ValuedAction __thiscall despot::Parser::ComputeMaxRewardAction(Parser *this)

{
  pointer pNVar1;
  pointer pFVar2;
  int r;
  ulong uVar3;
  long lVar4;
  int a;
  int _action;
  double _value;
  double dVar5;
  ValuedAction VVar6;
  ValuedAction max;
  ValuedAction local_40;
  
  ValuedAction::ValuedAction(&max,-1,-INFINITY);
  for (_action = 0;
      pNVar1 = (this->action_vars_).
               super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>._M_impl.
               super__Vector_impl_data._M_start,
      _action < (int)((ulong)((long)*(pointer *)
                                     ((long)&(pNVar1->super_Variable).values_.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     + 8) -
                             *(long *)&(pNVar1->super_Variable).values_.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data) >> 5);
      _action = _action + 1) {
    _value = 0.0;
    lVar4 = 0;
    for (uVar3 = 0;
        pFVar2 = (this->reward_funcs_).
                 super__Vector_base<despot::Function,_std::allocator<despot::Function>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar3 < (ulong)(((long)(this->reward_funcs_).
                               super__Vector_base<despot::Function,_std::allocator<despot::Function>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar2) / 0x58);
        uVar3 = uVar3 + 1) {
      dVar5 = (double)(**(code **)(*(long *)((long)&pFVar2->_vptr_Function + lVar4) + 0x50))
                                ((long)&pFVar2->_vptr_Function + lVar4,
                                 (this->action_vars_).
                                 super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                                 ._M_impl.super__Vector_impl_data._M_start,_action);
      _value = _value + dVar5;
      lVar4 = lVar4 + 0x58;
    }
    if (max.value < _value) {
      ValuedAction::ValuedAction(&local_40,_action,_value);
      max.action = local_40.action;
      max._4_4_ = local_40._4_4_;
      max.value = local_40.value;
    }
  }
  VVar6._0_8_ = max._0_8_ & 0xffffffff;
  VVar6.value = max.value;
  return VVar6;
}

Assistant:

ValuedAction Parser::ComputeMaxRewardAction() const {
	ValuedAction max(-1, Globals::NEG_INFTY);
	for (int a = 0; a < action_vars_[0].Size(); a++) {
		double reward = 0;
		for (int r = 0; r < reward_funcs_.size(); r++) {
			reward += reward_funcs_[r].ComputeConstrainedMaximum(
				&action_vars_[0], a);
		}
		if (reward > max.value) {
			max = ValuedAction(a, reward);
		}
	}
	return max;
}